

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_begin_sb(telnet_t *telnet,int telopt)

{
  int in_ECX;
  size_t __n;
  undefined2 local_5;
  undefined2 local_3;
  undefined1 local_1;
  
  if (telopt < 0x200) {
    local_5 = 0xfaff;
    if (telopt < 0x100) {
      local_3 = CONCAT11(local_3._1_1_,(char)telopt);
      __n = 3;
    }
    else {
      local_3 = 0xfaff;
      __n = 5;
      local_1 = (char)telopt;
    }
    _send((int)telnet,&local_5,__n,in_ECX);
  }
  else {
    _error(telnet,0x5e4,"telnet_begin_sb",TELNET_EBADVAL,0,
           "supplied telopt %d for subnegotiation is greater than 511",telopt);
  }
  return;
}

Assistant:

void telnet_begin_sb(telnet_t *telnet, int telopt) {
	unsigned char sb[5];

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for subnegotiation is greater than 511", telopt);
		return;
	}

	if (telopt > 255) {
		/* an EXOPL telopt */
		
		sb[0] = TELNET_IAC;
		sb[1] = TELNET_SB;
		sb[2] = TELNET_TELOPT_EXOPL;
		sb[3] = TELNET_SB;
		sb[4] = (unsigned char)(telopt - 256);

		_sendu(telnet, sb, 5);

		return;
	}
	
	sb[0] = TELNET_IAC;
	sb[1] = TELNET_SB;
	sb[2] = telopt;
	_sendu(telnet, sb, 3);
}